

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O2

void pbrt::DisplayStatic(string *title,Image *image,optional<pbrt::ImageChannelDesc> *channelDesc)

{
  bool bVar1;
  optional<pbrt::ImageChannelDesc> local_d0;
  DisplayItem item;
  
  pstd::optional<pbrt::ImageChannelDesc>::optional(&local_d0,channelDesc);
  GetImageDisplayItem(&item,title,image,&local_d0);
  pstd::optional<pbrt::ImageChannelDesc>::~optional(&local_d0);
  std::mutex::lock((mutex *)mutex);
  bVar1 = DisplayItem::Display(&item,channel);
  if (!bVar1 && LOGGING_LogLevel < 2) {
    Log<std::__cxx11::string_const&>
              (Error,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/display.cpp"
               ,0x1d3,"Unable to display static content \"%s\".",title);
  }
  pthread_mutex_unlock((pthread_mutex_t *)mutex);
  DisplayItem::~DisplayItem(&item);
  return;
}

Assistant:

void DisplayStatic(const std::string &title, const Image &image,
                   pstd::optional<ImageChannelDesc> channelDesc) {
    DisplayItem item = GetImageDisplayItem(title, image, channelDesc);

    std::lock_guard<std::mutex> lock(mutex);
    if (!item.Display(*channel))
        LOG_ERROR("Unable to display static content \"%s\".", title);
}